

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O0

void write_row_callback(png_structp png_ptr,png_uint_32 row_number,int pass)

{
  int pass_local;
  png_uint_32 row_number_local;
  png_structp png_ptr_local;
  
  if (png_ptr == (png_structp)0x0) {
    png_error(0,"write_row_callback: bad png_ptr");
  }
  if (0x7fffffff < row_number) {
    png_error(png_ptr,"write_row_callback: bad row number");
  }
  if ((pass < 0) || (7 < pass)) {
    png_error(png_ptr,"write_row_callback: bad pass");
  }
  fprintf(_stdout,"w");
  return;
}

Assistant:

static void PNGCBAPI
write_row_callback(png_structp png_ptr, png_uint_32 row_number, int pass)
{
   /* The callback should always receive correct parameters. */
   if (png_ptr == NULL)
      png_error(png_ptr, "write_row_callback: bad png_ptr");
   if (row_number > PNG_UINT_31_MAX)
      png_error(png_ptr, "write_row_callback: bad row number");
   if (pass < 0 || pass > 7)
      png_error(png_ptr, "write_row_callback: bad pass");

   fprintf(stdout, "w");
}